

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

void __thiscall
testing::internal::
PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<prometheus::ClientMetric::Label,_prometheus::ClientMetric::Label>_>_>
::~PredicateFormatterFromMatcher
          (PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<prometheus::ClientMetric::Label,_prometheus::ClientMetric::Label>_>_>
           *this)

{
  pointer pcVar1;
  undefined1 *puVar2;
  
  pcVar1 = (this->matcher_).matchers_.
           super__Tuple_impl<0UL,_prometheus::ClientMetric::Label,_prometheus::ClientMetric::Label>.
           super__Head_base<0UL,_prometheus::ClientMetric::Label,_false>._M_head_impl.value.
           _M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 !=
      &(this->matcher_).matchers_.
       super__Tuple_impl<0UL,_prometheus::ClientMetric::Label,_prometheus::ClientMetric::Label>.
       super__Head_base<0UL,_prometheus::ClientMetric::Label,_false>._M_head_impl.value.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->matcher_).matchers_.
           super__Tuple_impl<0UL,_prometheus::ClientMetric::Label,_prometheus::ClientMetric::Label>.
           super__Head_base<0UL,_prometheus::ClientMetric::Label,_false>._M_head_impl.name.
           _M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 !=
      &(this->matcher_).matchers_.
       super__Tuple_impl<0UL,_prometheus::ClientMetric::Label,_prometheus::ClientMetric::Label>.
       super__Head_base<0UL,_prometheus::ClientMetric::Label,_false>._M_head_impl.name.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->matcher_).matchers_.
           super__Tuple_impl<0UL,_prometheus::ClientMetric::Label,_prometheus::ClientMetric::Label>.
           super__Tuple_impl<1UL,_prometheus::ClientMetric::Label>.
           super__Head_base<1UL,_prometheus::ClientMetric::Label,_false>._M_head_impl.value.
           _M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&(this->matcher_).matchers_.
                 super__Tuple_impl<0UL,_prometheus::ClientMetric::Label,_prometheus::ClientMetric::Label>
                 .super__Tuple_impl<1UL,_prometheus::ClientMetric::Label>.
                 super__Head_base<1UL,_prometheus::ClientMetric::Label,_false>._M_head_impl.value +
         0x10U)) {
    operator_delete(pcVar1);
  }
  puVar2 = *(undefined1 **)
            &(this->matcher_).matchers_.
             super__Tuple_impl<0UL,_prometheus::ClientMetric::Label,_prometheus::ClientMetric::Label>
             .super__Tuple_impl<1UL,_prometheus::ClientMetric::Label>.
             super__Head_base<1UL,_prometheus::ClientMetric::Label,_false>._M_head_impl.name;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&(this->matcher_).matchers_.
                 super__Tuple_impl<0UL,_prometheus::ClientMetric::Label,_prometheus::ClientMetric::Label>
                 .super__Tuple_impl<1UL,_prometheus::ClientMetric::Label>.
                 super__Head_base<1UL,_prometheus::ClientMetric::Label,_false>._M_head_impl.name +
         0x10U)) {
    operator_delete(puVar2);
    return;
  }
  return;
}

Assistant:

explicit PredicateFormatterFromMatcher(M m) : matcher_(std::move(m)) {}